

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O1

int dfsfast_e(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  Flow_Data_t *pFVar5;
  int *piVar6;
  MinRegMan_t *pMVar7;
  int iVar8;
  ulong uVar9;
  Vec_Ptr_t *pVVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  
  if (pManMR->fSinkDistTerminate != 0) {
    return 0;
  }
  uVar2 = *(uint *)(pManMR->pDataArray + (uint)pObj->Id);
  if (((pManMR->constraintMask & uVar2 & 0x90) != 0) || ((*(uint *)&pObj->field_0x14 & 0xf) == 2)) {
    if (pPred == (Abc_Obj_t *)0x0) {
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                    ,0xdb,"int dfsfast_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
    if (pManMR->fIsForward == 0) {
      return 1;
    }
    __assert_fail("!pManMR->fIsForward",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                  ,0xdc,"int dfsfast_e(Abc_Obj_t *, Abc_Obj_t *)");
  }
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) = (ushort)uVar2 | 1;
  if (pManMR->fIsForward == 0) {
    if (0 < (pObj->vFanins).nSize) {
      lVar12 = 0;
      do {
        pAVar4 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar12]];
        pFVar5 = pManMR->pDataArray;
        uVar2 = pAVar4->Id;
        if ((((undefined1  [24])((undefined1  [24])pFVar5[uVar2] & (undefined1  [24])0x2) ==
              (undefined1  [24])0x0) &&
            ((uint)*(ushort *)&pFVar5[(uint)pObj->Id].field_0x10 ==
             *(ushort *)&pFVar5[uVar2].field_0x12 + 1)) &&
           (iVar8 = dfsfast_r(pAVar4,pPred), iVar8 != 0)) goto LAB_004d238c;
        lVar12 = lVar12 + 1;
      } while (lVar12 < (pObj->vFanins).nSize);
    }
  }
  else if (0 < (pObj->vFanouts).nSize) {
    lVar12 = 0;
    do {
      pAVar4 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar12]];
      pFVar5 = pManMR->pDataArray;
      uVar2 = pAVar4->Id;
      if ((((undefined1  [24])((undefined1  [24])pFVar5[uVar2] & (undefined1  [24])0x2) ==
            (undefined1  [24])0x0) &&
          ((uint)*(ushort *)&pFVar5[(uint)pObj->Id].field_0x10 ==
           *(ushort *)&pFVar5[uVar2].field_0x12 + 1)) &&
         (iVar8 = dfsfast_r(pAVar4,pPred), iVar8 != 0)) goto LAB_004d238c;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (pObj->vFanouts).nSize);
  }
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
    if (pManMR->fIsForward == 0) {
      if (0 < (pObj->vFanouts).nSize) {
        lVar12 = 0;
        do {
          pAVar4 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar12]];
          pFVar5 = pManMR->pDataArray;
          uVar2 = pAVar4->Id;
          if ((((undefined1  [24])((undefined1  [24])pFVar5[uVar2] & (undefined1  [24])0x1) ==
                (undefined1  [24])0x0) &&
              ((uint)*(ushort *)&pFVar5[(uint)pObj->Id].field_0x10 ==
               *(ushort *)&pFVar5[uVar2].field_0x10 + 1)) &&
             (iVar8 = dfsfast_e(pAVar4,pPred), iVar8 != 0)) goto LAB_004d238c;
          lVar12 = lVar12 + 1;
        } while (lVar12 < (pObj->vFanouts).nSize);
      }
      if (pManMR->maxDelay != 0) {
        uVar9 = (ulong)(uint)pObj->Id;
        if (0 < pManMR->vTimeEdges[uVar9].nSize) {
          pVVar10 = pManMR->vTimeEdges + uVar9;
          lVar12 = 0;
          do {
            pFVar5 = pManMR->pDataArray;
            uVar2 = ((Abc_Obj_t *)pVVar10->pArray[lVar12])->Id;
            if ((((undefined1  [24])((undefined1  [24])pFVar5[uVar2] & (undefined1  [24])0x1) ==
                  (undefined1  [24])0x0) &&
                ((uint)*(ushort *)&pFVar5[uVar9].field_0x10 ==
                 *(ushort *)&pFVar5[uVar2].field_0x10 + 1)) &&
               (iVar8 = dfsfast_e((Abc_Obj_t *)pVVar10->pArray[lVar12],pPred), iVar8 != 0))
            goto LAB_004d238c;
            lVar12 = lVar12 + 1;
            uVar9 = (ulong)(uint)pObj->Id;
            pVVar10 = pManMR->vTimeEdges + uVar9;
          } while (lVar12 < pManMR->vTimeEdges[uVar9].nSize);
        }
      }
    }
    pFVar5 = pManMR->pDataArray;
    uVar2 = pObj->Id;
    if ((((undefined1  [24])((undefined1  [24])pFVar5[uVar2] & (undefined1  [24])0x6) ==
          (undefined1  [24])0x4) &&
        ((*(uint *)&pFVar5[uVar2].field_0x10 & 0xffff) ==
         (*(uint *)&pFVar5[uVar2].field_0x10 >> 0x10) + 1)) &&
       (iVar8 = dfsfast_r(pObj,pFVar5[uVar2].field_1.pred), iVar8 != 0)) {
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffb;
      FSETPRED(pObj,(Abc_Obj_t *)0x0);
LAB_004d238c:
      *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
           *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffe;
      return 1;
    }
  }
  *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
       *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffe;
  pFVar5 = pManMR->pDataArray;
  uVar2 = pObj->Id;
  uVar3 = *(uint *)&pFVar5[uVar2].field_0x10;
  if (pManMR->fIsForward == 0) {
    lVar12 = (long)(pObj->vFanins).nSize;
    if (0 < lVar12) {
      uVar11 = 30000;
      lVar13 = 0;
      do {
        uVar14 = *(uint *)&pFVar5[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                                  [(pObj->vFanins).pArray[lVar13]] + 0x10)].
                           field_0x10 >> 0x10;
        if (uVar11 < uVar14) {
          uVar14 = uVar11;
        }
        if (0xffff < *(uint *)&pFVar5[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                                      [(pObj->vFanins).pArray[lVar13]] + 0x10)].
                               field_0x10) {
          uVar11 = uVar14;
        }
        lVar13 = lVar13 + 1;
      } while (lVar12 != lVar13);
      goto LAB_004d2494;
    }
  }
  else {
    lVar12 = (long)(pObj->vFanouts).nSize;
    if (0 < lVar12) {
      uVar11 = 30000;
      lVar13 = 0;
      do {
        uVar14 = *(uint *)&pFVar5[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                                  [(pObj->vFanouts).pArray[lVar13]] + 0x10)].
                           field_0x10 >> 0x10;
        if (uVar11 < uVar14) {
          uVar14 = uVar11;
        }
        if (0xffff < *(uint *)&pFVar5[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                                      [(pObj->vFanouts).pArray[lVar13]] + 0x10)].
                               field_0x10) {
          uVar11 = uVar14;
        }
        lVar13 = lVar13 + 1;
      } while (lVar12 != lVar13);
      goto LAB_004d2494;
    }
  }
  uVar11 = 30000;
LAB_004d2494:
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
    uVar14 = uVar3 >> 0x10;
    if (uVar11 < uVar3 >> 0x10) {
      uVar14 = uVar11;
    }
    if (uVar3 < 0x10000) {
      uVar14 = uVar11;
    }
    if ((undefined1  [24])((undefined1  [24])pFVar5[uVar2] & (undefined1  [24])0x4) ==
        (undefined1  [24])0x0) {
      uVar14 = uVar11;
    }
    uVar11 = uVar14;
    if (pManMR->fIsForward == 0) {
      lVar12 = (long)(pObj->vFanouts).nSize;
      if (0 < lVar12) {
        lVar13 = 0;
        do {
          uVar1 = *(ushort *)
                   &pFVar5[*(uint *)((long)pObj->pNtk->vObjs->pArray
                                           [(pObj->vFanouts).pArray[lVar13]] + 0x10)].field_0x10;
          uVar14 = (uint)uVar1;
          if (uVar11 < uVar1) {
            uVar14 = uVar11;
          }
          if (uVar1 != 0) {
            uVar11 = uVar14;
          }
          lVar13 = lVar13 + 1;
        } while (lVar12 != lVar13);
      }
      if (pManMR->maxDelay != 0) {
        lVar12 = (long)pManMR->vTimeEdges[uVar2].nSize;
        if (0 < lVar12) {
          lVar13 = 0;
          do {
            uVar1 = *(ushort *)
                     &pFVar5[*(uint *)((long)pManMR->vTimeEdges[uVar2].pArray[lVar13] + 0x10)].
                      field_0x10;
            uVar14 = (uint)uVar1;
            if (uVar11 < uVar1) {
              uVar14 = uVar11;
            }
            if (uVar1 != 0) {
              uVar11 = uVar14;
            }
            lVar13 = lVar13 + 1;
          } while (lVar12 != lVar13);
        }
      }
    }
  }
  uVar14 = uVar11 + 1;
  if (0x752e < uVar11) {
    uVar14 = 0;
  }
  *(uint *)&pFVar5[uVar2].field_0x10 = uVar3 & 0xffff0000 | uVar14 & 0xffff;
  pMVar7 = pManMR;
  if ((int)uVar14 < pManMR->vSinkDistHist->nSize) {
    piVar6 = pManMR->vSinkDistHist->pArray;
    piVar6[uVar3 & 0xffff] = piVar6[uVar3 & 0xffff] + -1;
    piVar6[uVar14] = piVar6[uVar14] + 1;
    if (piVar6[uVar3 & 0xffff] == 0) {
      pMVar7->fSinkDistTerminate = 1;
    }
    return 0;
  }
  __assert_fail("min_dist < Vec_IntSize(pManMR->vSinkDistHist)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/fret/fretFlow.c"
                ,0x1c9,"void dfsfast_e_retreat(Abc_Obj_t *)");
}

Assistant:

int dfsfast_e( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext;
  
  if (pManMR->fSinkDistTerminate) return 0;

  // have we reached the sink?
  if(FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask ||
     Abc_ObjIsPi(pObj)) {
    assert(pPred);
    assert(!pManMR->fIsForward);
    return 1;
  }

  FSET(pObj, VISITED_E);

#ifdef DEBUG_VISITED
  printf("(%de=%d) ", Abc_ObjId(pObj), FDATA(pObj)->e_dist);
#endif  

  // 1. structural edges
  if (pManMR->fIsForward)
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          FDIST(pObj, e, pNext, r) &&
          dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }
  else
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          FDIST(pObj, e, pNext, r) &&
          dfsfast_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }  
  
  if (Abc_ObjIsLatch(pObj))
    goto not_found;

  // 2. reverse edges (backward retiming only)
  if (!pManMR->fIsForward) { 
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_E) &&
          FDIST(pObj, e, pNext, e) &&
          dfsfast_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }

  // 3. timing edges (backward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t *, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_E) &&
            FDIST(pObj, e, pNext, e) &&
            dfsfast_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  // unwind
  if (FTEST(pObj, FLOW) && 
      !FTEST(pObj, VISITED_R) &&
      FDIST(pObj, e, pObj, r) &&
      dfsfast_r(pObj, FGETPRED(pObj))) {

    FUNSET(pObj, FLOW);
    FSETPRED(pObj, NULL);
#ifdef DEBUG_PRINT_FLOWS
    printf("u");
#endif
    goto found;
  }
  
 not_found:
  FUNSET(pObj, VISITED_E);
  dfsfast_e_retreat(pObj);
  return 0;
  
 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif 
  FUNSET(pObj, VISITED_E);
  return 1;
}